

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureCompressedFormatTests.cpp
# Opt level: O0

void vkt::texture::anon_unknown_1::populateTextureCompressedFormatTests
               (TestCaseGroup *compressedTextureTests)

{
  TestContext *context;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Compressed2DTestInstance> *this;
  char *pcVar1;
  Enum<vk::VkFormat,_4UL> EVar2;
  allocator<char> local_1f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  allocator<char> local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  value_type local_144;
  undefined1 local_140 [8];
  Compressed2DTestParameters testParameters;
  string local_f0;
  undefined1 local_d0 [8];
  string nameBase;
  GetNameFunc local_a0;
  VkFormat local_98;
  undefined1 local_90 [8];
  string formatStr;
  int formatNdx;
  int sizeNdx;
  anon_struct_16_3_6ebfea46 sizes [2];
  anon_struct_4_1_5583e935 etc2Formats [10];
  TestContext *testCtx;
  TestCaseGroup *compressedTextureTests_local;
  
  context = tcu::TestNode::getTestContext(&compressedTextureTests->super_TestNode);
  memcpy(&sizes[1].name,&DAT_0134b050,0x28);
  _formatNdx = 0x4000000080;
  sizes[0]._0_8_ = (long)"size_pot" + 5;
  sizes[0].name = (char *)0x4100000033;
  sizes[1]._0_8_ = (long)"size_npot" + 5;
  for (formatStr.field_2._12_4_ = 0; (int)formatStr.field_2._12_4_ < 2;
      formatStr.field_2._12_4_ = formatStr.field_2._12_4_ + 1) {
    for (formatStr.field_2._8_4_ = 0; (int)formatStr.field_2._8_4_ < 10;
        formatStr.field_2._8_4_ = formatStr.field_2._8_4_ + 1) {
      EVar2 = ::vk::getFormatStr(etc2Formats[(long)(int)formatStr.field_2._8_4_ + -2].format);
      nameBase.field_2._8_8_ = EVar2.m_getName;
      local_98 = EVar2.m_value;
      local_a0 = (GetNameFunc)nameBase.field_2._8_8_;
      de::toString<tcu::Format::Enum<vk::VkFormat,4ul>>
                ((string *)local_90,(de *)&local_a0,EVar2._8_8_);
      std::__cxx11::string::substr((ulong)&local_f0,(ulong)local_90);
      de::toLower((string *)local_d0,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      Compressed2DTestParameters::Compressed2DTestParameters
                ((Compressed2DTestParameters *)local_140);
      testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.wrapS =
           etc2Formats[(long)(int)formatStr.field_2._8_4_ + -2].format;
      testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
      programs.
      super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           (&formatNdx)[(long)(int)formatStr.field_2._12_4_ * 4];
      testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
      programs.
      super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           *(undefined4 *)((long)&sizes[(long)(int)formatStr.field_2._12_4_ + -1].name + 4);
      testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
      sampleCount = 0;
      testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
      texCoordPrecision = PRECISION_LOWP;
      local_144 = PROGRAM_2D_FLOAT;
      std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
      push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *
                )&testParameters.super_Texture2DTestCaseParameters.
                  super_TextureCommonTestCaseParameters.format,&local_144);
      this = (TextureTestCase<vkt::texture::(anonymous_namespace)::Compressed2DTestInstance> *)
             operator_new(0xb0);
      std::operator+(&local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "_2d_");
      std::operator+(&local_188,&local_1a8,*(char **)(sizes + (int)formatStr.field_2._12_4_));
      pcVar1 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,pcVar1,&local_1a9);
      std::operator+(&local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     ", TEXTURETYPE_2D");
      pcVar1 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,pcVar1,&local_1f1);
      util::TextureTestCase<vkt::texture::(anonymous_namespace)::Compressed2DTestInstance>::
      TextureTestCase(this,context,&local_168,&local_1d0,(ParameterType *)local_140);
      tcu::TestNode::addChild(&compressedTextureTests->super_TestNode,(TestNode *)this);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator(&local_1f1);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_1a9);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      Compressed2DTestParameters::~Compressed2DTestParameters
                ((Compressed2DTestParameters *)local_140);
      std::__cxx11::string::~string((string *)local_d0);
      std::__cxx11::string::~string((string *)local_90);
    }
  }
  return;
}

Assistant:

void populateTextureCompressedFormatTests (tcu::TestCaseGroup* compressedTextureTests)
{
	tcu::TestContext&	testCtx	= compressedTextureTests->getTestContext();

	// ETC2 and EAC compressed formats.
	const struct {
		const VkFormat	format;
	} etc2Formats[] =
	{
		{ VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK		},
		{ VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK		},
		{ VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK	},
		{ VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK	},
		{ VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK	},
		{ VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK	},

		{ VK_FORMAT_EAC_R11_UNORM_BLOCK			},
		{ VK_FORMAT_EAC_R11_SNORM_BLOCK			},
		{ VK_FORMAT_EAC_R11G11_UNORM_BLOCK		},
		{ VK_FORMAT_EAC_R11G11_SNORM_BLOCK		},
	};

	const struct {
		const int	width;
		const int	height;
		const char*	name;
	} sizes[] =
	{
		{ 128, 64, "pot"  },
		{ 51,  65, "npot" },
	};

	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes); sizeNdx++)
	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(etc2Formats); formatNdx++)
	{
		const string	formatStr	= de::toString(getFormatStr(etc2Formats[formatNdx].format));
		const string	nameBase	= de::toLower(formatStr.substr(10));

		Compressed2DTestParameters	testParameters;
		testParameters.format		= etc2Formats[formatNdx].format;
		testParameters.width		= sizes[sizeNdx].width;
		testParameters.height		= sizes[sizeNdx].height;
		testParameters.minFilter	= tcu::Sampler::NEAREST;
		testParameters.magFilter	= tcu::Sampler::NEAREST;
		testParameters.programs.push_back(PROGRAM_2D_FLOAT);

		compressedTextureTests->addChild(new TextureTestCase<Compressed2DTestInstance>(testCtx, (nameBase + "_2d_" + sizes[sizeNdx].name).c_str(), (formatStr + ", TEXTURETYPE_2D").c_str(), testParameters));
	}
}